

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float *__s;
  int iVar7;
  stbtt__active_edge *z;
  stbtt__point *points;
  long lVar8;
  ulong uVar9;
  stbtt__edge *p_00;
  float *scanline;
  stbtt__active_edge *psVar10;
  stbtt__active_edge *psVar11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  stbtt__active_edge *psVar15;
  stbtt__active_edge *psVar16;
  uchar uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  stbtt__bitmap *psVar22;
  undefined4 in_register_00000084;
  int iVar23;
  ulong uVar24;
  stbtt__edge *psVar25;
  uint uVar26;
  undefined8 *puVar27;
  void *p;
  int iVar28;
  nk_allocator *alloc;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar34;
  float fVar35;
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 in_register_000012c4 [12];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float y_bottom;
  stbtt__active_edge *active;
  float y0;
  int num_points;
  float local_308;
  int local_2f0;
  stbtt__active_edge local_2e0;
  undefined8 *local_2c0;
  undefined1 local_2b8 [16];
  long local_2a0;
  stbtt__bitmap *local_298;
  stbtt__active_edge *local_290;
  float *local_288;
  int local_280;
  float local_27c;
  float local_278;
  undefined1 local_268 [16];
  ulong local_258;
  float *local_250;
  stbtt__edge *local_248;
  ulong local_240;
  undefined8 local_238;
  int local_230;
  
  local_268._4_12_ = in_register_000012c4;
  local_268._0_4_ = shift_x;
  local_258 = CONCAT44(in_register_00000084,y_off);
  local_238 = local_238 & 0xffffffff00000000;
  local_2b8._0_4_ = num_verts;
  if (num_verts < 1) {
    uVar20 = 0;
  }
  else {
    lVar13 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + ((&vertices->type)[lVar13] == '\x01');
      lVar13 = lVar13 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar13);
  }
  points = (stbtt__point *)0x0;
  local_2e0.fx = scale_x;
  local_298 = result;
  local_278 = shift_y;
  if (uVar20 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (**(code **)((long)userdata + 8))(*userdata,0,(long)(int)uVar20 << 2);
    if (lVar13 == 0) {
LAB_0010ffdb:
      uVar20 = 0;
      points = (stbtt__point *)0x0;
    }
    else {
      fVar37 = scale_y;
      if (local_2e0.fx <= scale_y) {
        fVar37 = local_2e0.fx;
      }
      fVar37 = (flatness_in_pixels / fVar37) * (flatness_in_pixels / fVar37);
      uVar9 = 0;
      points = (stbtt__point *)0x0;
      local_2a0 = lVar13;
      iVar18 = 0;
      do {
        if (iVar18 == 0) {
LAB_0010fdad:
          local_238 = local_238 & 0xffffffff00000000;
          if ((int)local_2b8._0_4_ < 1) {
            lVar8 = -1;
          }
          else {
            fVar31 = 0.0;
            fVar39 = 0.0;
            uVar26 = 0xffffffff;
            lVar13 = 0;
            do {
              uVar14 = local_238;
              switch((&vertices->type)[lVar13]) {
              case '\x01':
                if (-1 < (int)uVar26) {
                  *(int *)(local_2a0 + (ulong)uVar26 * 4) = (int)(float)local_238 - (int)uVar9;
                }
                uVar26 = uVar26 + 1;
                uVar9 = local_238 & 0xffffffff;
                auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar13));
                auVar33 = pshuflw(auVar33,auVar33,0x60);
                iVar28 = auVar33._0_4_;
                iVar7 = auVar33._4_4_;
                break;
              case '\x02':
                auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar13));
                auVar33 = pshuflw(auVar33,auVar33,0x60);
                iVar28 = auVar33._0_4_;
                iVar7 = auVar33._4_4_;
                break;
              case '\x03':
                stbtt__tesselate_curve
                          (points,(int *)&local_238,fVar31,fVar39,
                           (float)(int)*(short *)((long)&vertices->cx + lVar13),
                           (float)(int)*(short *)((long)&vertices->cy + lVar13),
                           (float)(int)*(short *)((long)&vertices->x + lVar13),
                           (float)(int)*(short *)((long)&vertices->y + lVar13),fVar37,0);
                goto LAB_0010ff0e;
              case '\x04':
                stbtt__tesselate_cubic
                          (points,(int *)&local_238,fVar31,fVar39,
                           (float)(int)*(short *)((long)&vertices->cx + lVar13),
                           (float)(int)*(short *)((long)&vertices->cy + lVar13),
                           (float)(int)*(short *)((long)&vertices->cx1 + lVar13),
                           (float)(int)*(short *)((long)&vertices->cy1 + lVar13),
                           (float)(int)*(short *)((long)&vertices->x + lVar13),
                           (float)(int)*(short *)((long)&vertices->y + lVar13),fVar37,0);
LAB_0010ff0e:
                auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar13));
                auVar33 = pshuflw(auVar33,auVar33,0x60);
                fVar31 = (float)(auVar33._0_4_ >> 0x10);
                fVar39 = (float)(auVar33._4_4_ >> 0x10);
                uVar14 = local_238;
              default:
                goto switchD_0010fdeb_default;
              }
              uVar14 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              fVar39 = (float)(iVar7 >> 0x10);
              fVar31 = (float)(iVar28 >> 0x10);
              if (points != (stbtt__point *)0x0) {
                points[(int)(float)local_238].x = fVar31;
                points[(int)(float)local_238].y = fVar39;
              }
switchD_0010fdeb_default:
              local_238 = uVar14;
              lVar13 = lVar13 + 0xe;
            } while ((ulong)(uint)num_verts * 0xe != lVar13);
            lVar8 = (long)(int)uVar26;
            lVar13 = local_2a0;
          }
          *(int *)(lVar13 + lVar8 * 4) = (int)(float)local_238 - (int)uVar9;
          bVar29 = true;
        }
        else {
          bVar29 = false;
          points = (stbtt__point *)
                   (**(code **)((long)userdata + 8))(*userdata,0,(long)(int)(float)local_238 << 3);
          if (points != (stbtt__point *)0x0) goto LAB_0010fdad;
          points = (stbtt__point *)0x0;
        }
        if (!bVar29) {
          (**(code **)((long)userdata + 0x10))(*userdata);
          (**(code **)((long)userdata + 0x10))(*userdata);
          lVar13 = 0;
          goto LAB_0010ffdb;
        }
        bVar29 = iVar18 == 0;
        iVar18 = iVar18 + 1;
      } while (bVar29);
    }
  }
  if (points != (stbtt__point *)0x0) {
    local_308 = scale_y;
    if (invert != 0) {
      local_308 = -scale_y;
    }
    if ((int)uVar20 < 1) {
      lVar8 = 0x14;
    }
    else {
      uVar9 = 0;
      lVar8 = 0;
      do {
        lVar8 = (long)(int)lVar8 + (long)*(int *)(lVar13 + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar20 != uVar9);
      lVar8 = lVar8 * 0x14 + 0x14;
    }
    uVar26 = 0;
    p_00 = (stbtt__edge *)(**(code **)((long)userdata + 8))(*userdata,0,lVar8);
    uVar9 = local_258;
    if (p_00 != (stbtt__edge *)0x0) {
      if (0 < (int)uVar20) {
        uVar14 = 0;
        uVar26 = 0;
        iVar18 = 0;
        do {
          iVar28 = *(int *)(lVar13 + uVar14 * 4);
          if (0 < iVar28) {
            uVar24 = (ulong)(iVar28 - 1);
            uVar19 = 0;
            do {
              iVar7 = (int)uVar24;
              fVar37 = points[(long)iVar18 + (long)iVar7].y;
              fVar31 = points[(long)iVar18 + uVar19].y;
              if ((fVar37 != fVar31) || (NAN(fVar37) || NAN(fVar31))) {
                psVar25 = p_00 + (int)uVar26;
                p_00[(int)uVar26].invert = 0;
                iVar23 = (int)uVar19;
                iVar21 = iVar23;
                if (invert == 0) {
                  if (fVar37 < fVar31) goto LAB_001100ed;
                }
                else if (fVar31 < fVar37) {
LAB_001100ed:
                  psVar25->invert = 1;
                  iVar21 = iVar7;
                  iVar7 = iVar23;
                }
                fVar30 = points[(long)iVar18 + (long)iVar21].x * local_2e0.fx +
                         (float)local_268._0_4_;
                fVar34 = points[(long)iVar18 + (long)iVar21].y * local_308 + local_278;
                fVar35 = points[(long)iVar18 + (long)iVar7].x * local_2e0.fx +
                         (float)local_268._0_4_;
                fVar36 = points[(long)iVar18 + (long)iVar7].y * local_308 + local_278;
                psVar25->x0 = fVar30;
                psVar25->y0 = fVar34;
                psVar25->x1 = fVar35;
                psVar25->y1 = fVar36;
                uVar26 = uVar26 + 1;
              }
              uVar24 = uVar19 & 0xffffffff;
              uVar19 = uVar19 + 1;
            } while ((long)uVar19 < (long)*(int *)(lVar13 + uVar14 * 4));
          }
          iVar18 = iVar18 + iVar28;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar20);
      }
      stbtt__sort_edges_quicksort(p_00,uVar26);
      psVar22 = local_298;
      if (1 < (int)uVar26) {
        uVar14 = 1;
        do {
          uVar1 = p_00[uVar14].x0;
          uVar4 = p_00[uVar14].y0;
          local_230 = p_00[uVar14].invert;
          local_238._0_4_ = p_00[uVar14].x1;
          local_238._4_4_ = p_00[uVar14].y1;
          uVar19 = uVar14 & 0xffffffff;
          do {
            uVar20 = (uint)uVar19;
            if ((int)uVar20 < 1) break;
            fVar37 = p_00[uVar19 - 1].y0;
            if ((float)uVar4 < fVar37) {
              psVar25 = p_00 + uVar19;
              psVar25->invert = psVar25[-1].invert;
              fVar31 = psVar25[-1].y0;
              fVar39 = psVar25[-1].x1;
              fVar32 = psVar25[-1].y1;
              psVar25->x0 = psVar25[-1].x0;
              psVar25->y0 = fVar31;
              psVar25->x1 = fVar39;
              psVar25->y1 = fVar32;
              uVar19 = (ulong)(uVar20 - 1);
            }
            uVar20 = (uint)uVar19;
          } while ((float)uVar4 < fVar37);
          if (uVar14 != uVar20) {
            p_00[(int)uVar20].x0 = (float)uVar1;
            p_00[(int)uVar20].y0 = (float)uVar4;
            p_00[(int)uVar20].x1 = (float)local_238;
            p_00[(int)uVar20].y1 = (float)local_238._4_4_;
            p_00[(int)uVar20].invert = local_230;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar26);
      }
      local_2e0.next = (stbtt__active_edge *)0x0;
      local_2a0 = lVar13;
      if (local_298->w < 0x41) {
        scanline = (float *)&local_238;
      }
      else {
        scanline = (float *)(**(code **)((long)userdata + 8))
                                      (*userdata,0,(ulong)(uint)local_298->w * 8 + 4);
      }
      iVar18 = psVar22->h;
      iVar28 = psVar22->w;
      p_00[(int)uVar26].y0 = (float)(iVar18 + (int)uVar9) + 1.0;
      uVar14 = 0;
      if (iVar18 < 1) {
        local_2c0 = (undefined8 *)0x0;
        puVar27 = local_2c0;
        psVar25 = p_00;
      }
      else {
        local_288 = scanline + iVar28;
        local_27c = (float)x_off;
        local_250 = local_288 + 1;
        uVar9 = uVar9 & 0xffffffff;
        local_2c0 = (undefined8 *)0x0;
        local_2f0 = 0;
        local_290 = (stbtt__active_edge *)0x0;
        local_248 = p_00;
        do {
          __s = local_288;
          local_280 = (int)uVar9;
          local_2e0.fx = (float)local_280;
          fVar31 = local_2e0.fx + 1.0;
          memset(scanline,0,(long)psVar22->w << 2);
          memset(__s,0,(long)psVar22->w * 4 + 4);
          puVar27 = local_2c0;
          fVar37 = local_2e0.fx;
          psVar11 = local_290;
          if (local_2e0.next != (stbtt__active_edge *)0x0) {
            psVar10 = local_2e0.next;
            psVar15 = &local_2e0;
            do {
              psVar16 = psVar10;
              if (psVar10->ey <= fVar37) {
                psVar15->next = psVar10->next;
                psVar10->direction = 0.0;
                psVar10->next = psVar11;
                psVar16 = psVar15;
                psVar11 = psVar10;
              }
              psVar10 = psVar16->next;
              psVar15 = psVar16;
            } while (psVar10 != (stbtt__active_edge *)0x0);
          }
          fVar39 = p_00->y0;
          local_240 = uVar14;
          if (fVar39 <= fVar31) {
            bVar29 = (int)local_258 != 0;
            do {
              if ((fVar39 != p_00->y1) || (NAN(fVar39) || NAN(p_00->y1))) {
                if (psVar11 == (stbtt__active_edge *)0x0) {
                  puVar12 = puVar27;
                  psVar10 = psVar11;
                  if (local_2f0 == 0) {
                    puVar12 = (undefined8 *)(**(code **)((long)userdata + 8))(*userdata,0,0x6408);
                    fVar37 = local_2e0.fx;
                    if (puVar12 == (undefined8 *)0x0) {
                      psVar15 = (stbtt__active_edge *)0x0;
                      goto LAB_00110a8d;
                    }
                    *puVar12 = puVar27;
                    local_2f0 = 800;
                  }
                  lVar13 = (long)local_2f0;
                  local_2f0 = local_2f0 + -1;
                  psVar15 = (stbtt__active_edge *)(puVar12 + lVar13 * 4 + -3);
                  puVar27 = puVar12;
                }
                else {
                  psVar10 = psVar11->next;
                  psVar15 = psVar11;
                }
LAB_00110a8d:
                psVar11 = psVar10;
                if (psVar15 != (stbtt__active_edge *)0x0) {
                  uVar2 = p_00->x0;
                  uVar5 = p_00->y0;
                  uVar3 = p_00->x1;
                  uVar6 = p_00->y1;
                  fVar39 = ((float)uVar3 - (float)uVar2) / ((float)uVar6 - (float)uVar5);
                  psVar15->fdx = fVar39;
                  psVar15->fdy = (float)(-(uint)(fVar39 != 0.0) & (uint)(1.0 / fVar39));
                  psVar15->fx = ((fVar37 - (float)uVar5) * fVar39 + (float)uVar2) - local_27c;
                  psVar15->direction = *(float *)(&DAT_0015c680 + (ulong)(p_00->invert == 0) * 4);
                  psVar15->sy = (float)uVar5;
                  psVar15->ey = (float)uVar6;
                  psVar15->next = (stbtt__active_edge *)0x0;
                  if ((float)uVar6 < fVar37 && ((int)uVar14 == 0 && bVar29)) {
                    psVar15->ey = fVar37;
                  }
                  psVar15->next = local_2e0.next;
                  local_2e0.next = psVar15;
                }
              }
              fVar39 = p_00[1].y0;
              p_00 = p_00 + 1;
            } while (fVar39 <= fVar31);
          }
          local_290 = psVar11;
          local_2c0 = puVar27;
          if (local_2e0.next != (stbtt__active_edge *)0x0) {
            iVar18 = local_298->w;
            local_278 = (float)iVar18;
            psVar11 = local_2e0.next;
            do {
              fVar32 = psVar11->fx;
              fVar39 = psVar11->fdx;
              if ((fVar39 != 0.0) || (NAN(fVar39))) {
                fVar44 = fVar39 + fVar32;
                fVar45 = psVar11->sy;
                fVar38 = (float)(~-(uint)(fVar37 < fVar45) & (uint)fVar32 |
                                (uint)((fVar45 - fVar37) * fVar39 + fVar32) &
                                -(uint)(fVar37 < fVar45));
                if (0.0 <= fVar38) {
                  fVar40 = psVar11->ey;
                  fVar43 = (float)(-(uint)(fVar40 < fVar31) &
                                   (uint)((fVar40 - fVar37) * fVar39 + fVar32) |
                                  ~-(uint)(fVar40 < fVar31) & (uint)fVar44);
                  if (((0.0 <= fVar43) && (fVar38 < local_278)) && (fVar43 < local_278)) {
                    if (fVar45 <= fVar37) {
                      fVar45 = fVar37;
                    }
                    iVar28 = (int)fVar38;
                    if (fVar31 <= fVar40) {
                      fVar40 = fVar31;
                    }
                    if (iVar28 == (int)fVar43) {
                      lVar13 = (long)iVar28;
                      scanline[lVar13] =
                           (((fVar43 - (float)iVar28) + (fVar38 - (float)iVar28)) * -0.5 + 1.0) *
                           psVar11->direction * (fVar40 - fVar45) + scanline[lVar13];
                      fVar32 = (fVar40 - fVar45) * psVar11->direction;
                    }
                    else {
                      fVar39 = psVar11->fdy;
                      fVar42 = fVar43;
                      if (fVar43 < fVar38) {
                        fVar41 = fVar37 - fVar45;
                        fVar45 = (fVar37 - fVar40) + fVar31;
                        fVar39 = -fVar39;
                        fVar42 = fVar38;
                        fVar32 = fVar44;
                        fVar40 = fVar41 + fVar31;
                        fVar38 = fVar43;
                      }
                      iVar7 = (int)fVar42;
                      iVar28 = (int)fVar38 + 1;
                      fVar43 = ((float)iVar28 - fVar32) * fVar39 + fVar37;
                      fVar32 = psVar11->direction;
                      fVar44 = (fVar43 - fVar45) * fVar32;
                      lVar13 = (long)(int)fVar38;
                      scanline[lVar13] =
                           (((fVar38 - (float)(int)fVar38) + 1.0) * -0.5 + 1.0) * fVar44 +
                           scanline[lVar13];
                      if (iVar7 - iVar28 != 0 && iVar28 <= iVar7) {
                        do {
                          scanline[lVar13 + 1] =
                               fVar39 * fVar32 * 0.5 + fVar44 + scanline[lVar13 + 1];
                          fVar44 = fVar44 + fVar39 * fVar32;
                          lVar13 = lVar13 + 1;
                        } while (iVar7 + -1 != (int)lVar13);
                      }
                      lVar13 = (long)iVar7;
                      scanline[lVar13] =
                           (fVar40 - (fVar39 * (float)(iVar7 - iVar28) + fVar43)) *
                           (((fVar42 - (float)iVar7) + 0.0) * -0.5 + 1.0) * fVar32 + fVar44 +
                           scanline[lVar13];
                      fVar32 = (fVar40 - fVar45) * fVar32;
                    }
                    local_250[lVar13] = fVar32 + local_250[lVar13];
                    goto LAB_0011092c;
                  }
                }
                if (0 < iVar18) {
                  local_268 = ZEXT416((uint)fVar32);
                  local_2b8 = ZEXT416((uint)fVar44);
                  iVar28 = 0;
                  do {
                    fVar43 = (float)iVar28;
                    iVar7 = iVar28 + 1;
                    fVar38 = (float)iVar7;
                    fVar45 = (fVar43 - fVar32) / fVar39 + fVar37;
                    fVar40 = (fVar38 - fVar32) / fVar39 + fVar37;
                    if ((fVar43 <= fVar32) || (fVar44 <= fVar38)) {
                      if ((fVar44 < fVar43) && (fVar38 < fVar32)) {
                        stbtt__handle_clipped_edge
                                  (scanline,iVar28,psVar11,fVar32,fVar37,fVar38,fVar40);
                        fVar37 = fVar40;
                        fVar32 = fVar38;
LAB_001106a3:
                        stbtt__handle_clipped_edge
                                  (scanline,iVar28,psVar11,fVar32,fVar37,fVar43,fVar45);
                        fVar32 = fVar43;
                        goto LAB_001106bd;
                      }
                      if (((fVar32 < fVar43) && (fVar43 < fVar44)) ||
                         ((fVar44 < fVar43 && (fVar43 < fVar32)))) goto LAB_001106a3;
                      if (((fVar32 < fVar38) && (fVar38 < fVar44)) ||
                         ((fVar44 < fVar38 && (fVar38 < fVar32)))) goto LAB_0011060d;
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (scanline,iVar28,psVar11,fVar32,fVar37,fVar43,fVar45);
                      fVar37 = fVar45;
                      fVar32 = fVar43;
LAB_0011060d:
                      stbtt__handle_clipped_edge
                                (scanline,iVar28,psVar11,fVar32,fVar37,fVar38,fVar40);
                      fVar45 = fVar40;
                      fVar32 = fVar38;
LAB_001106bd:
                      fVar37 = fVar45;
                      fVar44 = (float)local_2b8._0_4_;
                    }
                    stbtt__handle_clipped_edge(scanline,iVar28,psVar11,fVar32,fVar37,fVar44,fVar31);
                    fVar37 = local_2e0.fx;
                    fVar32 = (float)local_268._0_4_;
                    fVar44 = (float)local_2b8._0_4_;
                    iVar28 = iVar7;
                  } while (iVar18 != iVar7);
                }
              }
              else if (fVar32 < local_278) {
                if (0.0 <= fVar32) {
                  local_268 = ZEXT416((uint)fVar32);
                  stbtt__handle_clipped_edge
                            (scanline,(int)fVar32,psVar11,fVar32,fVar37,fVar32,fVar31);
                  iVar28 = (int)fVar32 + 1;
                  fVar37 = local_2e0.fx;
                  fVar32 = (float)local_268._0_4_;
                }
                else {
                  iVar28 = 0;
                }
                stbtt__handle_clipped_edge(local_288,iVar28,psVar11,fVar32,fVar37,fVar32,fVar31);
                fVar37 = local_2e0.fx;
              }
LAB_0011092c:
              psVar11 = psVar11->next;
            } while (psVar11 != (stbtt__active_edge *)0x0);
          }
          psVar11 = local_2e0.next;
          if (0 < local_298->w) {
            fVar37 = 0.0;
            lVar13 = 0;
            do {
              fVar37 = fVar37 + local_288[lVar13];
              iVar18 = (int)(ABS(scanline[lVar13] + fVar37) * 255.0 + 0.5);
              uVar17 = (uchar)iVar18;
              if (0xfe < iVar18) {
                uVar17 = 0xff;
              }
              local_298->pixels[lVar13 + (long)local_298->stride * (long)(int)local_240] = uVar17;
              lVar13 = lVar13 + 1;
            } while (lVar13 < local_298->w);
          }
          for (; psVar11 != (stbtt__active_edge *)0x0; psVar11 = psVar11->next) {
            psVar11->fx = psVar11->fdx + psVar11->fx;
          }
          uVar9 = (ulong)(local_280 + 1);
          uVar20 = (int)local_240 + 1;
          uVar14 = (ulong)uVar20;
          psVar22 = local_298;
          puVar27 = local_2c0;
          psVar25 = local_248;
        } while ((int)uVar20 < local_298->h);
      }
      while (local_248 = psVar25, puVar27 != (undefined8 *)0x0) {
        puVar27 = (undefined8 *)*puVar27;
        (**(code **)((long)userdata + 0x10))(*userdata);
        psVar25 = local_248;
      }
      if (scanline != (float *)&local_238) {
        (**(code **)((long)userdata + 0x10))(*userdata,scanline);
      }
      (**(code **)((long)userdata + 0x10))(*userdata,psVar25);
      lVar13 = local_2a0;
    }
    (**(code **)((long)userdata + 0x10))(*userdata,lVar13);
    (**(code **)((long)userdata + 0x10))(*userdata,points);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
float scale            = scale_x > scale_y ? scale_y : scale_x;
int winding_count      = 0;
int *winding_lengths   = NULL;
stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
if (windings) {
stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
STBTT_free(winding_lengths, userdata);
STBTT_free(windings, userdata);
}
}